

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptionList.cpp
# Opt level: O0

void __thiscall curlpp::internal::OptionList::~OptionList(OptionList *this)

{
  bool bVar1;
  reference ppVar2;
  _Rb_tree_iterator<std::pair<const_CURLoption,_curlpp::OptionBase_*>_> *in_RDI;
  iterator pos;
  map<CURLoption,_curlpp::OptionBase_*,_std::less<CURLoption>,_std::allocator<std::pair<const_CURLoption,_curlpp::OptionBase_*>_>_>
  *in_stack_ffffffffffffffc8;
  OptionBase *pOVar3;
  _Self local_18;
  _Self local_10 [2];
  
  in_RDI->_M_node = (_Base_ptr)&PTR__OptionList_00162d38;
  local_10[0]._M_node =
       (_Base_ptr)
       std::
       map<CURLoption,_curlpp::OptionBase_*,_std::less<CURLoption>,_std::allocator<std::pair<const_CURLoption,_curlpp::OptionBase_*>_>_>
       ::begin(in_stack_ffffffffffffffc8);
  while( true ) {
    local_18._M_node =
         (_Base_ptr)
         std::
         map<CURLoption,_curlpp::OptionBase_*,_std::less<CURLoption>,_std::allocator<std::pair<const_CURLoption,_curlpp::OptionBase_*>_>_>
         ::end(in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=(local_10,&local_18);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_CURLoption,_curlpp::OptionBase_*>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_CURLoption,_curlpp::OptionBase_*>_> *)
                        0x14f361);
    pOVar3 = ppVar2->second;
    if (pOVar3 != (OptionBase *)0x0) {
      (*pOVar3->_vptr_OptionBase[1])();
    }
    std::_Rb_tree_iterator<std::pair<const_CURLoption,_curlpp::OptionBase_*>_>::operator++
              (in_RDI,(int)((ulong)pOVar3 >> 0x20));
  }
  std::
  map<CURLoption,_curlpp::OptionBase_*,_std::less<CURLoption>,_std::allocator<std::pair<const_CURLoption,_curlpp::OptionBase_*>_>_>
  ::~map((map<CURLoption,_curlpp::OptionBase_*,_std::less<CURLoption>,_std::allocator<std::pair<const_CURLoption,_curlpp::OptionBase_*>_>_>
          *)0x14f39c);
  return;
}

Assistant:

OptionList::~OptionList()
{
  mapType::iterator pos = mOptions.begin();
  while (pos != mOptions.end()) {
    delete (*pos).second;
    pos++;
  }
}